

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O3

char * get_param_word(char **str,char **end_pos,char endchar)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  
  pcVar5 = *str;
  cVar7 = *pcVar5;
  pcVar2 = pcVar5;
  if (cVar7 == '\"') {
    pcVar4 = pcVar5 + 1;
    pcVar3 = (char *)0x0;
    pcVar6 = pcVar4;
LAB_0010e282:
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '\\') {
        if ((pcVar6[1] == '\\') || (pcVar6[1] == '\"')) {
          if (pcVar3 == (char *)0x0) {
            pcVar3 = pcVar6;
          }
          pcVar6 = pcVar6 + 2;
          goto LAB_0010e282;
        }
      }
      else {
        if (cVar1 == '\0') break;
        if (cVar1 == '\"') goto LAB_0010e2e0;
      }
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  while (((pcVar6 = pcVar2, cVar7 != '\0' && (cVar7 != ';')) && (cVar7 != endchar))) {
    pcVar2 = pcVar6 + 1;
    cVar7 = pcVar6[1];
  }
  *end_pos = pcVar6;
  pcVar4 = pcVar5;
LAB_0010e33b:
  *str = pcVar6;
  return pcVar4;
LAB_0010e2e0:
  *end_pos = pcVar6;
  pcVar5 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    do {
      cVar7 = *pcVar5;
      if ((*pcVar5 == '\\') && ((cVar1 = pcVar5[1], cVar1 == '\\' || (cVar7 = '\\', cVar1 == '\"')))
         ) {
        pcVar5 = pcVar5 + 1;
        cVar7 = cVar1;
      }
      pcVar6 = pcVar5 + 1;
      *pcVar3 = cVar7;
      pcVar3 = pcVar3 + 1;
      pcVar5 = pcVar6;
    } while (pcVar6 < *end_pos);
    *end_pos = pcVar3;
  }
  for (; ((cVar7 = *pcVar6, cVar7 != '\0' && (cVar7 != ';')) && (cVar7 != endchar));
      pcVar6 = pcVar6 + 1) {
  }
  goto LAB_0010e33b;
}

Assistant:

static char *get_param_word(char **str, char **end_pos, char endchar)
{
  char *ptr = *str;
  /* the first non-space char is here */
  char *word_begin = ptr;
  char *ptr2;
  char *escape = NULL;

  if(*ptr == '"') {
    ++ptr;
    while(*ptr) {
      if(*ptr == '\\') {
        if(ptr[1] == '\\' || ptr[1] == '"') {
          /* remember the first escape position */
          if(!escape)
            escape = ptr;
          /* skip escape of back-slash or double-quote */
          ptr += 2;
          continue;
        }
      }
      if(*ptr == '"') {
        *end_pos = ptr;
        if(escape) {
          /* has escape, we restore the unescaped string here */
          ptr = ptr2 = escape;
          do {
            if(*ptr == '\\' && (ptr[1] == '\\' || ptr[1] == '"'))
              ++ptr;
            *ptr2++ = *ptr++;
          }
          while(ptr < *end_pos);
          *end_pos = ptr2;
        }
        while(*ptr && *ptr != ';' && *ptr != endchar)
          ++ptr;
        *str = ptr;
        return word_begin + 1;
      }
      ++ptr;
    }
    /* end quote is missing, treat it as non-quoted. */
    ptr = word_begin;
  }

  while(*ptr && *ptr != ';' && *ptr != endchar)
    ++ptr;
  *str = *end_pos = ptr;
  return word_begin;
}